

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adjacency_graph.hpp
# Opt level: O0

span<unsigned_long,_18446744073709551615UL> __thiscall
Disa::Adjacency_Graph<true>::operator[](Adjacency_Graph<true> *this,size_t *i_vertex)

{
  source_location *psVar1;
  value_type vVar2;
  source_location *location;
  ostream *poVar3;
  reference pvVar4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_130;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_128;
  string local_120;
  string local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined **local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  unsigned_long *local_28;
  size_t *i_vertex_local;
  Adjacency_Graph<true> *this_local;
  
  psVar1 = (source_location *)*i_vertex;
  local_28 = i_vertex;
  i_vertex_local = (size_t *)this;
  location = (source_location *)size_vertex(this);
  if (location <= psVar1) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"\n");
    local_50 = &PTR_s__workspace_llm4binary_github_lic_001dc150;
    console_format_abi_cxx11_(&local_48,(Disa *)0x0,(Log_Level)&local_50,location);
    poVar3 = std::operator<<(poVar3,(string *)&local_48);
    std::__cxx11::to_string(&local_100,*local_28);
    std::operator+(&local_e0,"Vertex index ",&local_100);
    std::operator+(&local_c0,&local_e0," not in range [0, ");
    std::__cxx11::to_string(&local_120,*local_28);
    std::operator+(&local_a0,&local_c0,&local_120);
    std::operator+(&local_80,&local_a0,").");
    poVar3 = std::operator<<(poVar3,(string *)&local_80);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_48);
    exit(1);
  }
  local_130._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 (&this->vertex_adjacent_list);
  this_00 = &this->offset;
  pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](this_00,*local_28)
  ;
  local_128 = __gnu_cxx::
              __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              ::operator+(&local_130,*pvVar4);
  pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     (this_00,*local_28 + 1);
  vVar2 = *pvVar4;
  pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](this_00,*local_28)
  ;
  std::span<unsigned_long,_18446744073709551615UL>::
  span<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            ((span<unsigned_long,_18446744073709551615UL> *)&this_local,local_128,vVar2 - *pvVar4);
  return _this_local;
}

Assistant:

[[nodiscard]] inline std::span<std::size_t> operator[](const std::size_t& i_vertex) {
    ASSERT_DEBUG(i_vertex < size_vertex(),
                 "Vertex index " + std::to_string(i_vertex) + " not in range [0, " + std::to_string(i_vertex) + ").");
    return {vertex_adjacent_list.begin() + static_cast<s_size_t>(offset[i_vertex]),
            offset[i_vertex + 1] - offset[i_vertex]};
  }